

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
bssl::der::test::ParserTest_CanReadRawTLV_Test::TestBody(ParserTest_CanReadRawTLV_Test *this)

{
  Input in;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_1b8;
  AssertHelper local_198;
  Message local_190;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__1;
  Input tlv_data;
  Message local_110;
  uint local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  size_t tlv_len;
  undefined1 local_d0 [8];
  ByteReader tlv_reader;
  string local_b8;
  AssertHelper local_98;
  Message local_90 [3];
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  Input tlv;
  Span<const_unsigned_char> local_40;
  undefined1 local_30 [8];
  Parser parser;
  uint8_t der [3];
  ParserTest_CanReadRawTLV_Test *this_local;
  
  parser.advance_len_._6_1_ = 1;
  parser.advance_len_._4_2_ = 0x102;
  Span<unsigned_char_const>::Span<3ul>
            ((Span<unsigned_char_const> *)&tlv.data_.size_,
             (uchar (*) [3])((long)&parser.advance_len_ + 4));
  Input::Input((Input *)&local_40,stack0xffffffffffffffb0);
  Parser::Parser((Parser *)local_30,(Input)local_40);
  Input::Input((Input *)&gtest_ar_.message_);
  local_71 = Parser::ReadRawTLV((Parser *)local_30,(Input *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_70,(AssertionResult *)"parser.ReadRawTLV(&tlv)","false",
               "true",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parser_unittest.cc"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    ::std::__cxx11::string::~string((string *)&local_b8);
    testing::Message::~Message(local_90);
  }
  tlv_reader.data_.size_._5_3_ = 0;
  tlv_reader.data_.size_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  if (tlv_reader.data_.size_._4_4_ == 0) {
    in.data_.size_ = (size_t)tlv.data_.data_;
    in.data_.data_ =
         (uchar *)gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
    ByteReader::ByteReader((ByteReader *)local_d0,in);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )ByteReader::BytesLeft((ByteReader *)local_d0);
    local_104 = 3;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_100,"3u","tlv_len",&local_104,(unsigned_long *)&gtest_ar.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&tlv_data.data_.size_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parser_unittest.cc"
                 ,0x29,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&tlv_data.data_.size_,&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tlv_data.data_.size_);
      testing::Message::~Message(&local_110);
    }
    tlv_reader.data_.size_._5_3_ = 0;
    tlv_reader.data_.size_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
    if (tlv_reader.data_.size_._4_4_ == 0) {
      Input::Input((Input *)&gtest_ar__1.message_);
      local_139 = ByteReader::ReadBytes
                            ((ByteReader *)local_d0,
                             (size_t)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl,(Input *)&gtest_ar__1.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_138,&local_139,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
      if (!bVar1) {
        testing::Message::Message(&local_148);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__2.message_,(internal *)local_138,
                   (AssertionResult *)"tlv_reader.ReadBytes(tlv_len, &tlv_data)","false","true",
                   in_R9);
        pcVar2 = (char *)::std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parser_unittest.cc"
                   ,0x2b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_150,&local_148);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        ::std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_148);
      }
      tlv_reader.data_.size_._5_3_ = 0;
      tlv_reader.data_.size_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
      if (tlv_reader.data_.size_._4_4_ == 0) {
        local_181 = Parser::HasMore((Parser *)local_30);
        local_181 = !local_181;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_180,&local_181,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
        if (!bVar1) {
          testing::Message::Message(&local_190);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_1b8,(internal *)local_180,(AssertionResult *)"parser.HasMore()","true",
                     "false",in_R9);
          pcVar2 = (char *)::std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_198,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parser_unittest.cc"
                     ,0x2c,pcVar2);
          testing::internal::AssertHelper::operator=(&local_198,&local_190);
          testing::internal::AssertHelper::~AssertHelper(&local_198);
          ::std::__cxx11::string::~string((string *)&local_1b8);
          testing::Message::~Message(&local_190);
        }
        tlv_reader.data_.size_._5_3_ = 0;
        tlv_reader.data_.size_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
      }
    }
  }
  return;
}

Assistant:

TEST(ParserTest, CanReadRawTLV) {
  const uint8_t der[] = {0x02, 0x01, 0x01};
  Parser parser((Input(der)));
  Input tlv;
  ASSERT_TRUE(parser.ReadRawTLV(&tlv));
  ByteReader tlv_reader(tlv);
  size_t tlv_len = tlv_reader.BytesLeft();
  ASSERT_EQ(3u, tlv_len);
  Input tlv_data;
  ASSERT_TRUE(tlv_reader.ReadBytes(tlv_len, &tlv_data));
  ASSERT_FALSE(parser.HasMore());
}